

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O1

void __thiscall solitaire::graphics::Renderer::renderFoundationPile(Renderer *this,PileId *id)

{
  GraphicsSystem *pGVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Position local_28;
  uint local_20;
  uint local_1c;
  
  iVar2 = (*this->context->_vptr_Context[5])();
  local_20 = id->t;
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x68))
                             ((long *)CONCAT44(extraout_var,iVar2));
  plVar3 = (long *)(**(code **)(*plVar3 + 0x30))(plVar3);
  if (*plVar3 == plVar3[1]) {
    local_28.x = id->t;
    iVar2 = (*this->context->_vptr_Context[7])(this->context,&local_28);
    local_28 = (Position)
               (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x20))
                         ((long *)CONCAT44(extraout_var_01,iVar2));
    pGVar1 = (this->graphicsSystem)._M_t.
             super___uniq_ptr_impl<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             .super__Head_base<0UL,_solitaire::graphics::interfaces::GraphicsSystem_*,_false>.
             _M_head_impl;
    local_1c = (this->cardPlaceholderId).t;
    (*pGVar1->_vptr_GraphicsSystem[5])
              (pGVar1,&local_1c,&local_28,(anonymous_namespace)::cardPlaceholderTextureArea);
  }
  else {
    local_28.x = id->t;
    iVar2 = (*this->context->_vptr_Context[7])(this->context,&local_28);
    local_28 = (Position)
               (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))
                         ((long *)CONCAT44(extraout_var_00,iVar2));
    renderCard(this,&local_28,(Card *)(plVar3[1] + -8));
  }
  return;
}

Assistant:

void Renderer::renderFoundationPile(const PileId id) const {
    const auto& pileCards = context.getSolitaire().getFoundationPile(id).getCards();

    if (pileCards.empty())
        renderCardPlaceholder(getFoundationPilePosition(id));
    else
        renderCard(getFoundationPilePosition(id), pileCards.back());
}